

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O1

ED * __thiscall ED::getGradImage(ED *this)

{
  long in_RSI;
  _OutputArray local_40;
  _InputArray local_28;
  
  cv::Mat::Mat((Mat *)this);
  local_28.obj = (void *)(in_RSI + 0x1a0);
  local_28.sz.width = 0;
  local_28.sz.height = 0;
  local_28.flags = 0x1010000;
  local_40.super__InputArray.sz.width = 0;
  local_40.super__InputArray.sz.height = 0;
  local_40.super__InputArray.flags = 0x2010000;
  local_40.super__InputArray.obj = this;
  cv::convertScaleAbs(&local_28,&local_40,1.0,0.0);
  return this;
}

Assistant:

Mat ED::getGradImage()
{	
	Mat result8UC1;
	convertScaleAbs(gradImage, result8UC1);
	
	return result8UC1;
}